

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O3

void mdct_backward(mdct_lookup *init,float *in,float *out)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  int *piVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  lVar15 = (long)(init->n >> 1);
  pfVar1 = out + lVar15;
  lVar8 = (long)(init->n >> 2);
  pfVar14 = pfVar1 + lVar8;
  pfVar6 = init->trig;
  lVar10 = lVar15 * 4 + -0x1c;
  pfVar7 = out + lVar15 + lVar8 + -1;
  pfVar5 = pfVar6 + lVar8 + 3;
  do {
    pfVar9 = (float *)((long)in + lVar10);
    pfVar7[-3] = -pfVar9[2] * *pfVar5 - pfVar5[-1] * *pfVar9;
    pfVar7[-2] = *pfVar9 * *pfVar5 - pfVar5[-1] * pfVar9[2];
    pfVar7[-1] = -pfVar9[6] * pfVar5[-2] - pfVar5[-3] * pfVar9[4];
    *pfVar7 = pfVar9[4] * pfVar5[-2] - pfVar5[-3] * pfVar9[6];
    lVar10 = lVar10 + -0x20;
    pfVar7 = pfVar7 + -4;
    pfVar5 = pfVar5 + 4;
  } while (in <= pfVar9 + -8);
  pfVar5 = in + lVar15 + -8;
  pfVar9 = pfVar6 + lVar8 + -1;
  pfVar7 = pfVar14;
  do {
    *pfVar7 = pfVar5[4] * *pfVar9 + pfVar5[6] * pfVar9[-1];
    pfVar7[1] = pfVar5[4] * pfVar9[-1] - *pfVar9 * pfVar5[6];
    pfVar7[2] = *pfVar5 * pfVar9[-2] + pfVar5[2] * pfVar9[-3];
    pfVar7[3] = *pfVar5 * pfVar9[-3] - pfVar9[-2] * pfVar5[2];
    pfVar5 = pfVar5 + -8;
    pfVar7 = pfVar7 + 4;
    pfVar9 = pfVar9 + -4;
  } while (in <= pfVar5);
  mdct_butterflies((mdct_lookup *)(ulong)(uint)init->log2n,pfVar6,(int)pfVar1);
  iVar3 = init->n;
  pfVar5 = init->trig;
  piVar4 = init->bitrev;
  pfVar7 = out + (iVar3 >> 1);
  lVar10 = 0;
  pfVar6 = pfVar7;
  do {
    lVar12 = (long)*(int *)((long)piVar4 + lVar10 + 4);
    fVar19 = pfVar7[(long)*(int *)((long)piVar4 + lVar10) + 1] - pfVar7[lVar12 + 1];
    fVar17 = pfVar7[*(int *)((long)piVar4 + lVar10)] + pfVar7[lVar12];
    fVar16 = *(float *)((long)pfVar5 + lVar10 + (long)iVar3 * 4);
    fVar18 = *(float *)((long)pfVar5 + lVar10 + (long)iVar3 * 4 + 4);
    fVar20 = fVar17 * fVar16 + fVar19 * fVar18;
    fVar18 = fVar17 * fVar18 - fVar19 * fVar16;
    fVar17 = (pfVar7[(long)*(int *)((long)piVar4 + lVar10) + 1] + pfVar7[lVar12 + 1]) * 0.5;
    fVar16 = (pfVar7[*(int *)((long)piVar4 + lVar10)] - pfVar7[lVar12]) * 0.5;
    pfVar9 = (float *)((long)out + lVar10 + 0x10);
    pfVar9[-4] = fVar17 + fVar20;
    pfVar6[-2] = fVar17 - fVar20;
    pfVar9[-3] = fVar16 + fVar18;
    pfVar6[-1] = fVar18 - fVar16;
    lVar12 = (long)*(int *)((long)piVar4 + lVar10 + 8);
    lVar13 = (long)*(int *)((long)piVar4 + lVar10 + 0xc);
    fVar19 = pfVar7[lVar12 + 1] - pfVar7[lVar13 + 1];
    fVar17 = pfVar7[lVar12] + pfVar7[lVar13];
    fVar16 = *(float *)((long)pfVar5 + lVar10 + (long)iVar3 * 4 + 8);
    fVar18 = *(float *)((long)pfVar5 + lVar10 + (long)iVar3 * 4 + 0xc);
    fVar20 = fVar17 * fVar16 + fVar19 * fVar18;
    fVar18 = fVar17 * fVar18 - fVar19 * fVar16;
    fVar17 = (pfVar7[lVar12 + 1] + pfVar7[lVar13 + 1]) * 0.5;
    fVar16 = (pfVar7[lVar12] - pfVar7[lVar13]) * 0.5;
    pfVar9[-2] = fVar17 + fVar20;
    pfVar6[-4] = fVar17 - fVar20;
    pfVar9[-1] = fVar16 + fVar18;
    pfVar6[-3] = fVar18 - fVar16;
    pfVar6 = pfVar6 + -4;
    lVar10 = lVar10 + 0x10;
  } while (pfVar9 < pfVar6);
  pfVar5 = pfVar5 + 7;
  pfVar6 = out + lVar8;
  pfVar7 = pfVar6;
  pfVar9 = pfVar14;
  pfVar11 = out;
  do {
    pfVar2 = pfVar7 + lVar15 + -4;
    pfVar2[3] = *pfVar11 * pfVar5[lVar15 + -6] - pfVar5[lVar15 + -7] * pfVar11[1];
    pfVar6[lVar15] = -(*pfVar11 * pfVar5[lVar15 + -7] + pfVar11[1] * pfVar5[lVar15 + -6]);
    pfVar2[2] = pfVar11[2] * pfVar5[lVar15 + -4] - pfVar5[lVar15 + -5] * pfVar11[3];
    pfVar9[1] = -(pfVar11[2] * pfVar5[lVar15 + -5] + pfVar11[3] * pfVar5[lVar15 + -4]);
    pfVar2[1] = pfVar11[4] * pfVar5[lVar15 + -2] - pfVar5[lVar15 + -3] * pfVar11[5];
    pfVar9[2] = -(pfVar11[4] * pfVar5[lVar15 + -3] + pfVar11[5] * pfVar5[lVar15 + -2]);
    *pfVar2 = pfVar11[6] * pfVar5[lVar15] - pfVar5[lVar15 + -1] * pfVar11[7];
    pfVar9[3] = -(pfVar11[6] * pfVar5[lVar15 + -1] + pfVar11[7] * pfVar5[lVar15]);
    pfVar9 = pfVar9 + 4;
    pfVar11 = pfVar11 + 8;
    pfVar5 = pfVar5 + 8;
    pfVar7 = pfVar7 + -4;
    pfVar6 = pfVar6 + 4;
  } while (pfVar11 < pfVar2);
  pfVar6 = out + lVar8;
  pfVar7 = out + lVar8;
  do {
    pfVar5 = pfVar7 + -4;
    fVar16 = pfVar7[lVar15 + -1];
    pfVar7[-1] = fVar16;
    *pfVar6 = -fVar16;
    fVar16 = pfVar7[lVar15 + -2];
    pfVar7[-2] = fVar16;
    pfVar6[1] = -fVar16;
    fVar16 = pfVar7[lVar15 + -3];
    pfVar7[-3] = fVar16;
    pfVar6[2] = -fVar16;
    fVar16 = pfVar5[lVar15];
    *pfVar5 = fVar16;
    pfVar6[3] = -fVar16;
    pfVar6 = pfVar6 + 4;
    pfVar7 = pfVar5;
  } while (pfVar6 < pfVar5 + lVar15);
  pfVar6 = out + lVar15 + lVar8 + 3;
  do {
    pfVar14[-4] = *pfVar6;
    pfVar14[-3] = pfVar6[-1];
    pfVar14[-2] = pfVar6[-2];
    pfVar14[-1] = pfVar6[-3];
    pfVar14 = pfVar14 + -4;
    pfVar6 = pfVar6 + 4;
  } while (pfVar1 < pfVar14);
  return;
}

Assistant:

void mdct_backward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;

  /* rotate */

  DATA_TYPE *iX = in+n2-7;
  DATA_TYPE *oX = out+n2+n4;
  DATA_TYPE *T  = init->trig+n4;

  do{
    oX         -= 4;
    oX[0]       = MULT_NORM(-iX[2] * T[3] - iX[0]  * T[2]);
    oX[1]       = MULT_NORM (iX[0] * T[3] - iX[2]  * T[2]);
    oX[2]       = MULT_NORM(-iX[6] * T[1] - iX[4]  * T[0]);
    oX[3]       = MULT_NORM (iX[4] * T[1] - iX[6]  * T[0]);
    iX         -= 8;
    T          += 4;
  }while(iX>=in);

  iX            = in+n2-8;
  oX            = out+n2+n4;
  T             = init->trig+n4;

  do{
    T          -= 4;
    oX[0]       =  MULT_NORM (iX[4] * T[3] + iX[6] * T[2]);
    oX[1]       =  MULT_NORM (iX[4] * T[2] - iX[6] * T[3]);
    oX[2]       =  MULT_NORM (iX[0] * T[1] + iX[2] * T[0]);
    oX[3]       =  MULT_NORM (iX[0] * T[0] - iX[2] * T[1]);
    iX         -= 8;
    oX         += 4;
  }while(iX>=in);

  mdct_butterflies(init,out+n2,n2);
  mdct_bitreverse(init,out);

  /* roatate + window */

  {
    DATA_TYPE *oX1=out+n2+n4;
    DATA_TYPE *oX2=out+n2+n4;
    DATA_TYPE *iX =out;
    T             =init->trig+n2;

    do{
      oX1-=4;

      oX1[3]  =  MULT_NORM (iX[0] * T[1] - iX[1] * T[0]);
      oX2[0]  = -MULT_NORM (iX[0] * T[0] + iX[1] * T[1]);

      oX1[2]  =  MULT_NORM (iX[2] * T[3] - iX[3] * T[2]);
      oX2[1]  = -MULT_NORM (iX[2] * T[2] + iX[3] * T[3]);

      oX1[1]  =  MULT_NORM (iX[4] * T[5] - iX[5] * T[4]);
      oX2[2]  = -MULT_NORM (iX[4] * T[4] + iX[5] * T[5]);

      oX1[0]  =  MULT_NORM (iX[6] * T[7] - iX[7] * T[6]);
      oX2[3]  = -MULT_NORM (iX[6] * T[6] + iX[7] * T[7]);

      oX2+=4;
      iX    +=   8;
      T     +=   8;
    }while(iX<oX1);

    iX=out+n2+n4;
    oX1=out+n4;
    oX2=oX1;

    do{
      oX1-=4;
      iX-=4;

      oX2[0] = -(oX1[3] = iX[3]);
      oX2[1] = -(oX1[2] = iX[2]);
      oX2[2] = -(oX1[1] = iX[1]);
      oX2[3] = -(oX1[0] = iX[0]);

      oX2+=4;
    }while(oX2<iX);

    iX=out+n2+n4;
    oX1=out+n2+n4;
    oX2=out+n2;
    do{
      oX1-=4;
      oX1[0]= iX[3];
      oX1[1]= iX[2];
      oX1[2]= iX[1];
      oX1[3]= iX[0];
      iX+=4;
    }while(oX1>oX2);
  }
}